

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall cmState::CreateBaseSnapshot(Snapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmState::SnapshotDataType> *this_00;
  PointerType pSVar1;
  iterator it;
  iterator iVar2;
  PositionType pos;
  iterator local_38;
  
  this_00 = &this->SnapshotData;
  it.Position = 0;
  it.Tree = this_00;
  local_38 = cmLinkedTree<cmState::SnapshotDataType>::Extend(this_00,it);
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_38);
  (pSVar1->DirectoryParent).Tree = this_00;
  (pSVar1->DirectoryParent).Position = 0;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_38);
  pSVar1->SnapshotType = BuildsystemDirectoryType;
  iVar2.Position = 0;
  iVar2.Tree = &this->BuildsystemDirectory;
  iVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend
                    (&this->BuildsystemDirectory,iVar2);
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_38);
  pSVar1->BuildSystemDirectory = iVar2;
  __return_storage_ptr__->State = this;
  (__return_storage_ptr__->Position).Tree = local_38.Tree;
  (__return_storage_ptr__->Position).Position = local_38.Position;
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::CreateBaseSnapshot()
{
  PositionType pos = this->SnapshotData.Extend(this->SnapshotData.Root());
  pos->DirectoryParent = this->SnapshotData.Root();
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Extend(this->BuildsystemDirectory.Root());
  return cmState::Snapshot(this, pos);
}